

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  long in_RDI;
  int *in_R9;
  uint *in_stack_00000008;
  cpp_dec_float<50U,_int,_void> *in_stack_00000030;
  cpp_dec_float<50U,_int,_void> *in_stack_00000038;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000040;
  uint *in_stack_00000048;
  int *in_stack_00000050;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000058;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000060;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000100;
  int *in_stack_00000300;
  int *in_stack_00000308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000310;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffa98;
  cpp_dec_float<50U,_int,_void> *pcVar5;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffaa0;
  cpp_dec_float<50U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb10;
  cpp_dec_float<50U,_int,_void> local_414;
  cpp_dec_float<50U,_int,_void> local_3dc;
  undefined4 local_3a4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc8c;
  int *in_stack_fffffffffffffc90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc98;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffca0;
  int *local_248;
  uint local_230;
  int local_22c;
  int in_stack_fffffffffffffe3c;
  int *in_stack_fffffffffffffe40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe48;
  int *in_stack_fffffffffffffe50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe58;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe60;
  
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  pcVar5 = in_stack_00000030;
  this_00 = in_stack_00000038;
  vSolveLright2(in_stack_00000060,in_stack_00000058,in_stack_00000050,(int *)in_stack_00000048,
                in_stack_00000040,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_00000038,in_stack_00000300,in_stack_00000308,in_stack_00000310);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
  lVar2 = *(long *)(in_RDI + 0x130);
  if (in_stack_00000040 ==
      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)0x0) {
    local_230 = 0;
    for (local_22c = 0; local_22c < (int)*in_stack_00000008; local_22c = local_22c + 1) {
      iVar1 = in_R9[local_22c];
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar5);
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      if (bVar3) {
        enQueueMax(in_R9,(int *)&local_230,*(int *)(lVar2 + (long)iVar1 * 4));
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
    *in_stack_00000008 = local_230;
  }
  else {
    local_248 = in_stack_00000050;
    local_230 = 0;
    for (local_22c = 0; local_22c < (int)*in_stack_00000008; local_22c = local_22c + 1) {
      iVar1 = in_R9[local_22c];
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar5);
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      if (bVar3) {
        *local_248 = iVar1;
        enQueueMax(in_R9,(int *)&local_230,*(int *)(lVar2 + (long)iVar1 * 4));
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar5);
        local_248 = local_248 + 1;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
    *in_stack_00000008 = local_230;
    *in_stack_00000048 = local_230;
  }
  local_230 = 0;
  for (local_22c = 0;
      local_22c <
      (int)(((cpp_dec_float<50U,_int,_void> *)&in_stack_00000038->data)->data)._M_elems[0];
      local_22c = local_22c + 1) {
    uVar4 = (in_stack_00000030->data)._M_elems[local_22c];
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,pcVar5);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    if (bVar3) {
      enQueueMax((int *)in_stack_00000030,(int *)&local_230,*(int *)(lVar2 + (long)(int)uVar4 * 4));
    }
    else {
      local_3a4 = 0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (this_00,(long_long_type)pcVar5);
    }
  }
  (((cpp_dec_float<50U,_int,_void> *)&in_stack_00000038->data)->data)._M_elems[0] = local_230;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = &local_3dc;
  uVar4 = vSolveUright(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50
                       ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                       in_stack_fffffffffffffe3c,in_stack_00000100);
  *in_stack_00000008 = uVar4;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = &local_414;
  uVar4 = vSolveUright(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50
                       ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                       in_stack_fffffffffffffe3c,in_stack_00000100);
  (((cpp_dec_float<50U,_int,_void> *)&in_stack_00000038->data)->data)._M_elems[0] = uVar4;
  if (*(int *)(in_RDI + 400) == 0) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    uVar4 = vSolveUpdateRight(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                              in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                              in_stack_fffffffffffffc80);
    *in_stack_00000008 = uVar4;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    uVar4 = vSolveUpdateRight(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                              in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                              in_stack_fffffffffffffc80);
    (((cpp_dec_float<50U,_int,_void> *)&in_stack_00000038->data)->data)._M_elems[0] = uVar4;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}